

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O0

void mbedtls_ripemd160_finish(mbedtls_ripemd160_context *ctx,uchar *output)

{
  uint uVar1;
  uint local_34;
  uchar local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  uchar msglen [8];
  uint32_t low;
  uint32_t high;
  uint32_t padn;
  uint32_t last;
  uchar *output_local;
  mbedtls_ripemd160_context *ctx_local;
  
  uVar1 = ctx->total[1] << 3;
  msglen._4_4_ = ctx->total[0] >> 0x1d | uVar1;
  msglen._0_4_ = ctx->total[0] << 3;
  local_30 = (uchar)msglen._0_4_;
  local_2f = (undefined1)((uint)msglen._0_4_ >> 8);
  local_2e = (undefined1)((uint)msglen._0_4_ >> 0x10);
  local_2d = (undefined1)((uint)msglen._0_4_ >> 0x18);
  local_2c = (undefined1)msglen._4_4_;
  local_2b = (undefined1)(uVar1 >> 8);
  local_2a = (undefined1)(uVar1 >> 0x10);
  local_29 = (undefined1)(uVar1 >> 0x18);
  local_34 = ctx->total[0] & 0x3f;
  if (local_34 < 0x38) {
    local_34 = 0x38 - local_34;
  }
  else {
    local_34 = 0x78 - local_34;
  }
  mbedtls_ripemd160_update(ctx,ripemd160_padding,(ulong)local_34);
  mbedtls_ripemd160_update(ctx,&local_30,8);
  *output = (uchar)ctx->state[0];
  output[1] = (uchar)(ctx->state[0] >> 8);
  output[2] = (uchar)(ctx->state[0] >> 0x10);
  output[3] = (uchar)(ctx->state[0] >> 0x18);
  output[4] = (uchar)ctx->state[1];
  output[5] = (uchar)(ctx->state[1] >> 8);
  output[6] = (uchar)(ctx->state[1] >> 0x10);
  output[7] = (uchar)(ctx->state[1] >> 0x18);
  output[8] = (uchar)ctx->state[2];
  output[9] = (uchar)(ctx->state[2] >> 8);
  output[10] = (uchar)(ctx->state[2] >> 0x10);
  output[0xb] = (uchar)(ctx->state[2] >> 0x18);
  output[0xc] = (uchar)ctx->state[3];
  output[0xd] = (uchar)(ctx->state[3] >> 8);
  output[0xe] = (uchar)(ctx->state[3] >> 0x10);
  output[0xf] = (uchar)(ctx->state[3] >> 0x18);
  output[0x10] = (uchar)ctx->state[4];
  output[0x11] = (uchar)(ctx->state[4] >> 8);
  output[0x12] = (uchar)(ctx->state[4] >> 0x10);
  output[0x13] = (uchar)(ctx->state[4] >> 0x18);
  return;
}

Assistant:

void mbedtls_ripemd160_finish( mbedtls_ripemd160_context *ctx, unsigned char output[20] )
{
    uint32_t last, padn;
    uint32_t high, low;
    unsigned char msglen[8];

    high = ( ctx->total[0] >> 29 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    PUT_UINT32_LE( low,  msglen, 0 );
    PUT_UINT32_LE( high, msglen, 4 );

    last = ctx->total[0] & 0x3F;
    padn = ( last < 56 ) ? ( 56 - last ) : ( 120 - last );

    mbedtls_ripemd160_update( ctx, ripemd160_padding, padn );
    mbedtls_ripemd160_update( ctx, msglen, 8 );

    PUT_UINT32_LE( ctx->state[0], output,  0 );
    PUT_UINT32_LE( ctx->state[1], output,  4 );
    PUT_UINT32_LE( ctx->state[2], output,  8 );
    PUT_UINT32_LE( ctx->state[3], output, 12 );
    PUT_UINT32_LE( ctx->state[4], output, 16 );
}